

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

void dpfb::args::pickDefaultPlugin<dpfb::FontRendererCreator>(char **arg,char *errorMsg)

{
  FontRendererCreator *this;
  char *pcVar1;
  FontRendererCreator *p;
  char *errorMsg_local;
  char **arg_local;
  
  if (**arg == '\0') {
    this = FontRendererCreator::getFirst();
    if (this == (FontRendererCreator *)0x0) {
      fputs(errorMsg,_stderr);
      exit(1);
    }
    pcVar1 = FontRendererCreator::getName(this);
    *arg = pcVar1;
  }
  return;
}

Assistant:

void pickDefaultPlugin(const char*& arg, const char* errorMsg)
{
    if (arg[0])
        return;

    const auto* p = T::getFirst();
    if (!p) {
        std::fputs(errorMsg, stderr);
        std::exit(EXIT_FAILURE);
    }
    arg = p->getName();
}